

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::visit(ExprWriter *this,DoWhile *expr)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->ss,"do {");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*expr->body->_vptr_Expr[2])(expr->body,this);
  std::operator<<(this->ss,"} while (");
  (*expr->cond->_vptr_Expr[2])(expr->cond,this);
  poVar1 = std::operator<<(this->ss,");");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ExprWriter::visit(DoWhile& expr) {
    ss << "do {" << std::endl;
    expr.body->accept(*this);
    ss << "} while (";
    expr.cond->accept(*this);
    ss << ");" << std::endl;
}